

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O0

bool __thiscall
FNodeBuilder::CheckSubsectorOverlappingSegs
          (FNodeBuilder *this,DWORD set,node_t *node,DWORD *splitseg)

{
  bool bVar1;
  FPrivSeg *pFVar2;
  uint local_40;
  uint local_3c;
  DWORD seg2;
  DWORD seg1;
  int v2;
  int v1;
  DWORD *splitseg_local;
  node_t *node_local;
  FNodeBuilder *pFStack_18;
  DWORD set_local;
  FNodeBuilder *this_local;
  
  local_3c = set;
  _v2 = splitseg;
  splitseg_local = (DWORD *)node;
  node_local._4_4_ = set;
  pFStack_18 = this;
  do {
    if (local_3c == 0xffffffff) {
      return false;
    }
    pFVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)local_3c);
    if (pFVar2->linedef != -1) {
      pFVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)local_3c);
      seg1 = pFVar2->v1;
      pFVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)local_3c);
      seg2 = pFVar2->v2;
      pFVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)local_3c);
      local_40 = pFVar2->next;
      while (local_40 != 0xffffffff) {
        pFVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                           (&this->Segs,(ulong)local_40);
        if ((pFVar2->v1 == seg1) &&
           (pFVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                               (&this->Segs,(ulong)local_40), pFVar2->v2 == seg2)) {
          pFVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                             (&this->Segs,(ulong)local_40);
          if (pFVar2->linedef == -1) {
            swapvalues<unsigned_int>(&local_3c,&local_40);
          }
          *_v2 = 0xffffffff;
          bVar1 = ShoveSegBehind(this,node_local._4_4_,(node_t *)splitseg_local,local_40,local_3c);
          return bVar1;
        }
        pFVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                           (&this->Segs,(ulong)local_40);
        local_40 = pFVar2->next;
      }
    }
    pFVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)local_3c);
    local_3c = pFVar2->next;
  } while( true );
}

Assistant:

bool FNodeBuilder::CheckSubsectorOverlappingSegs (DWORD set, node_t &node, DWORD &splitseg)
{
	int v1, v2;
	DWORD seg1, seg2;

	for (seg1 = set; seg1 != DWORD_MAX; seg1 = Segs[seg1].next)
	{
		if (Segs[seg1].linedef == -1)
		{ // Do not check minisegs.
			continue;
		}
		v1 = Segs[seg1].v1;
		v2 = Segs[seg1].v2;
		for (seg2 = Segs[seg1].next; seg2 != DWORD_MAX; seg2 = Segs[seg2].next)
		{
			if (Segs[seg2].v1 == v1 && Segs[seg2].v2 == v2)
			{
				if (Segs[seg2].linedef == -1)
				{ // Do not put minisegs into a new subsector.
					swapvalues (seg1, seg2);
				}
				D(Printf(PRINT_LOG, "Need to synthesize a splitter for set %d on seg %d (ov)\n", set, seg2));
				splitseg = DWORD_MAX;

				return ShoveSegBehind (set, node, seg2, seg1);
			}
		}
	}
	// It really is a good subsector.
	return false;
}